

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_getfloat(HSQUIRRELVM v,SQInteger idx,SQFloat *f)

{
  SQObjectType SVar1;
  long lVar2;
  SQObjectPtr *pSVar3;
  SQRESULT SVar4;
  SQFloat SVar5;
  
  pSVar3 = stack_get(v,idx);
  SVar1 = (pSVar3->super_SQObject)._type;
  if ((SVar1 >> 0x1a & 1) == 0) {
    SVar4 = -1;
  }
  else {
    lVar2 = (pSVar3->super_SQObject)._unVal.nInteger;
    SVar5 = (SQFloat)lVar2;
    if (SVar1 == OT_INTEGER) {
      SVar5 = (SQFloat)lVar2;
    }
    *f = SVar5;
    SVar4 = 0;
  }
  return SVar4;
}

Assistant:

SQRESULT sq_getfloat(HSQUIRRELVM v,SQInteger idx,SQFloat *f)
{
    SQObjectPtr &o = stack_get(v, idx);
    if(sq_isnumeric(o)) {
        *f = tofloat(o);
        return SQ_OK;
    }
    return SQ_ERROR;
}